

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSearchPath.cxx
# Opt level: O2

void __thiscall
cmSearchPath::AddSuffixes
          (cmSearchPath *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *suffixes)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  pointer pbVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  pointer path;
  string p;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_00 = &this->Paths;
  path = (this->Paths).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->Paths).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->Paths).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->Paths).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Paths).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Paths).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = path;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pbVar1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(this_00,(((long)(suffixes->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(suffixes->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 5) + 1) *
                    ((long)pbVar1 - (long)path >> 5));
  for (; path != pbVar1; path = path + 1) {
    cmsys::SystemTools::ConvertToUnixSlashes(path);
    std::__cxx11::string::string((string *)&local_70,(string *)path);
    if ((local_70._M_string_length != 0) &&
       (local_70._M_dataplus._M_p[local_70._M_string_length - 1] != '/')) {
      std::__cxx11::string::append((char *)&local_70);
    }
    for (__rhs = (suffixes->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        __rhs != (suffixes->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish; __rhs = __rhs + 1) {
      std::operator+(&local_50,&local_70,__rhs);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                 &local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(this_00,path);
    std::__cxx11::string::~string((string *)&local_70);
    pbVar1 = local_88.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  return;
}

Assistant:

void cmSearchPath::AddSuffixes(const std::vector<std::string>& suffixes)
{
  std::vector<std::string> inPaths;
  inPaths.swap(this->Paths);
  this->Paths.reserve(inPaths.size()*(suffixes.size()+1));

  for(std::vector<std::string>::iterator ip = inPaths.begin();
      ip != inPaths.end(); ++ip)
    {
    cmSystemTools::ConvertToUnixSlashes(*ip);

    // if *i is only / then do not add a //
    // this will get incorrectly considered a network
    // path on windows and cause huge delays.
    std::string p = *ip;
    if(!p.empty() && *p.rbegin() != '/')
      {
      p += "/";
      }

    // Combine with all the suffixes
    for(std::vector<std::string>::const_iterator s = suffixes.begin();
        s != suffixes.end(); ++s)
      {
      this->Paths.push_back(p+*s);
      }

    // And now the original w/o any suffix
    this->Paths.push_back(*ip);
    }
}